

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vle(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 addr;
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  TCGv_i64 val;
  TCGv_i64 tmp;
  uint8_t enr;
  uint8_t es;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar1 = (byte)s->insn->data;
  iVar3 = get_field1(s,FLD_O_m3,FLD_C_i3);
  _Var2 = valid_vec_element((uint8_t)iVar3,(uint)bVar1);
  if (_Var2) {
    val = tcg_temp_new_i64(tcg_ctx_00);
    addr = o->addr1;
    iVar4 = get_mem_index(s);
    tcg_gen_qemu_ld_i64_s390x(tcg_ctx_00,val,addr,(long)iVar4,bVar1 | MO_BE);
    iVar4 = get_field1(s,FLD_O_v1,FLD_C_b1);
    write_vec_element_i64(tcg_ctx_00,val,iVar4,(uint8_t)iVar3,(uint)bVar1);
    tcg_temp_free_i64(tcg_ctx_00,val);
    s_local._4_4_ = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vle(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = s->insn->data;
    const uint8_t enr = get_field(s, m3);
    TCGv_i64 tmp;

    if (!valid_vec_element(enr, es)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_qemu_ld_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TE | es);
    write_vec_element_i64(tcg_ctx, tmp, get_field(s, v1), enr, es);
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}